

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

JsonObjectWriter * __thiscall Catch::JsonArrayWriter::writeObject(JsonArrayWriter *this)

{
  ostream *in_RSI;
  JsonObjectWriter *in_RDI;
  JsonObjectWriter *this_00;
  
  this_00 = in_RDI;
  JsonUtils::appendCommaNewline((ostream *)in_RDI,(bool *)in_RSI,0x18b7cb);
  JsonObjectWriter::JsonObjectWriter(this_00,in_RSI,0x18b7e4);
  return in_RDI;
}

Assistant:

JsonObjectWriter JsonArrayWriter::writeObject() {
        JsonUtils::appendCommaNewline(
            m_os, m_should_comma, m_indent_level + 1 );
        return JsonObjectWriter{ m_os, m_indent_level + 1 };
    }